

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::initBuiltinKernelOverrides(CLIntercept *this,cl_context context)

{
  double dVar1;
  size_t sVar2;
  cl_int cVar3;
  mapped_type *ppSVar4;
  mapped_type pSVar5;
  cl_program p_Var6;
  void *pvVar7;
  cl_kernel p_Var8;
  char *pcVar9;
  ulong uVar10;
  cl_uint i;
  CBuiltinKernelOverridesMap *this_00;
  pthread_mutex_t *__mutex;
  allocator local_95;
  cl_int errorCode;
  pthread_mutex_t *local_90;
  cl_context context_local;
  cl_uint numDevices;
  mapped_type local_78;
  size_t buildLogSize;
  char *pProgramString;
  string local_60 [32];
  CBuiltinKernelOverridesMap *local_40;
  size_t programStringLength;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  context_local = context;
  std::mutex::lock((mutex *)&__mutex->__data);
  dVar1 = (double)std::__cxx11::string::string
                            (local_60,"Initializing builtin kernel overrides...\n",
                             (allocator *)&pProgramString);
  log(this,dVar1);
  std::__cxx11::string::~string(local_60);
  errorCode = 0;
  this_00 = &this->m_BuiltinKernelOverridesMap;
  ppSVar4 = std::
            map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
            ::operator[](this_00,&context_local);
  pSVar5 = *ppSVar4;
  if (pSVar5 != (mapped_type)0x0) {
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_block_motion_estimate_intel);
    errorCode = (*(this->m_Dispatch).clReleaseProgram)(pSVar5->Program);
    operator_delete(pSVar5);
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
              ::operator[](this_00,&context_local);
    *ppSVar4 = (mapped_type)0x0;
  }
  pSVar5 = (mapped_type)operator_new(0x10);
  pProgramString = (char *)0x0;
  programStringLength = 0;
  pSVar5->Program = (cl_program)0x0;
  pSVar5->Kernel_block_motion_estimate_intel = (cl_kernel)0x0;
  if (errorCode == 0) {
    pProgramString = &_binary_kernels_builtin_kernels_cl_start;
    programStringLength = 0xc0f;
    p_Var6 = (*(this->m_Dispatch).clCreateProgramWithSource)
                       (context_local,1,&pProgramString,&programStringLength,&errorCode);
    pSVar5->Program = p_Var6;
    if (errorCode == 0) {
      errorCode = (*(this->m_Dispatch).clBuildProgram)
                            (p_Var6,0,(cl_device_id *)0x0,
                             "-Dcl_intel_device_side_vme_enable -DHW_NULL_CHECK",
                             (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
      if (errorCode != 0) {
        numDevices = 0;
        local_90 = __mutex;
        local_78 = pSVar5;
        local_40 = this_00;
        (*(this->m_Dispatch).clGetContextInfo)(context_local,0x1083,4,&numDevices,(size_t *)0x0);
        if ((ulong)numDevices != 0) {
          uVar10 = (ulong)numDevices << 3;
          pvVar7 = operator_new__(uVar10);
          cVar3 = (*(this->m_Dispatch).clGetContextInfo)
                            (context_local,0x1081,uVar10,pvVar7,(size_t *)0x0);
          if (cVar3 == 0) {
            for (uVar10 = 0; uVar10 < numDevices; uVar10 = uVar10 + 1) {
              buildLogSize = 0;
              (*(this->m_Dispatch).clGetProgramBuildInfo)
                        (local_78->Program,*(cl_device_id *)((long)pvVar7 + uVar10 * 8),0x1183,0,
                         (void *)0x0,&buildLogSize);
              sVar2 = buildLogSize;
              pcVar9 = (char *)operator_new__(buildLogSize + 1);
              (*(this->m_Dispatch).clGetProgramBuildInfo)
                        (local_78->Program,*(cl_device_id *)((long)pvVar7 + uVar10 * 8),0x1183,sVar2
                         ,pcVar9,(size_t *)0x0);
              pcVar9[buildLogSize] = '\0';
              dVar1 = (double)std::__cxx11::string::string
                                        (local_60,"-------> Start of Build Log:\n",&local_95);
              log(this,dVar1);
              std::__cxx11::string::~string(local_60);
              dVar1 = (double)std::__cxx11::string::string(local_60,pcVar9,&local_95);
              log(this,dVar1);
              std::__cxx11::string::~string(local_60);
              dVar1 = (double)std::__cxx11::string::string
                                        (local_60,"<------- End of Build Log!\n",&local_95);
              log(this,dVar1);
              std::__cxx11::string::~string(local_60);
              operator_delete__(pcVar9);
            }
          }
        }
        pSVar5 = local_78;
        this_00 = local_40;
        __mutex = local_90;
        if (errorCode != 0) goto LAB_0016efb9;
      }
      p_Var8 = (*(this->m_Dispatch).clCreateKernel)
                         (pSVar5->Program,"block_motion_estimate_intel",&errorCode);
      pSVar5->Kernel_block_motion_estimate_intel = p_Var8;
      if (errorCode == 0) {
        ppSVar4 = std::
                  map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                  ::operator[](this_00,&context_local);
        *ppSVar4 = pSVar5;
        goto LAB_0016efc1;
      }
    }
  }
LAB_0016efb9:
  operator_delete(pSVar5);
LAB_0016efc1:
  dVar1 = (double)std::__cxx11::string::string
                            (local_60,"... builtin kernel override initialization complete.\n",
                             (allocator *)&pProgramString);
  log(this,dVar1);
  std::__cxx11::string::~string(local_60);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::initBuiltinKernelOverrides(
    const cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Initializing builtin kernel overrides...\n" );

    cl_int  errorCode = CL_SUCCESS;

    // Check to see if overrides already exist.  If they do, release them.
    SBuiltinKernelOverrides*    pOverrides =
        m_BuiltinKernelOverridesMap[ context ];
    if( pOverrides )
    {
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_block_motion_estimate_intel );

        errorCode = dispatch().clReleaseProgram( pOverrides->Program );

        delete pOverrides;
        pOverrides = NULL;

        m_BuiltinKernelOverridesMap[ context ] = NULL;
    }

    // Allocate new overrides.
    pOverrides = new SBuiltinKernelOverrides;
    if( pOverrides )
    {
        pOverrides->Program = NULL;

        pOverrides->Kernel_block_motion_estimate_intel = NULL;

        const char* pProgramString = NULL;
        size_t  programStringLength = 0;

        // Get the builtin kernel program string.
        if( errorCode == CL_SUCCESS )
        {
            if( m_OS.GetBuiltinKernelString(
                    pProgramString,
                    programStringLength ) == false )
            {
                errorCode = CL_INVALID_VALUE;
            }
        }

        // Create the program:
        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Program = dispatch().clCreateProgramWithSource(
                context,
                1,
                &pProgramString,
                &programStringLength,
                &errorCode );
        }

        // Build the program:
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clBuildProgram(
                pOverrides->Program,
                0,
                NULL,
                "-Dcl_intel_device_side_vme_enable -DHW_NULL_CHECK",
                NULL,
                NULL );

            if( errorCode != CL_SUCCESS )
            {
                cl_int  tempErrorCode = CL_SUCCESS;

                // Get the number of devices for this context.
                cl_uint numDevices = 0;
                tempErrorCode = dispatch().clGetContextInfo(
                    context,
                    CL_CONTEXT_NUM_DEVICES,
                    sizeof( numDevices ),
                    &numDevices,
                    NULL );

                if( numDevices != 0 )
                {
                    cl_device_id*   devices = new cl_device_id[ numDevices ];
                    if( devices )
                    {
                        tempErrorCode = dispatch().clGetContextInfo(
                            context,
                            CL_CONTEXT_DEVICES,
                            numDevices * sizeof( cl_device_id ),
                            devices,
                            NULL );

                        if( tempErrorCode == CL_SUCCESS )
                        {
                            for( cl_uint i = 0; i < numDevices; i++ )
                            {
                                size_t  buildLogSize = 0;
                                dispatch().clGetProgramBuildInfo(
                                    pOverrides->Program,
                                    devices[ i ],
                                    CL_PROGRAM_BUILD_LOG,
                                    0,
                                    NULL,
                                    &buildLogSize );

                                char*   buildLog = new char[ buildLogSize + 1 ];
                                if( buildLog )
                                {
                                    dispatch().clGetProgramBuildInfo(
                                        pOverrides->Program,
                                        devices[ i ],
                                        CL_PROGRAM_BUILD_LOG,
                                        buildLogSize * sizeof( char ),
                                        buildLog,
                                        NULL );

                                    buildLog[ buildLogSize ] = '\0';

                                    log( "-------> Start of Build Log:\n" );
                                    log( buildLog );
                                    log( "<------- End of Build Log!\n" );

                                    delete [] buildLog;
                                }
                            }
                        }
                    }
                }
            }
        }

        // Create all of the kernels in the program:

        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Kernel_block_motion_estimate_intel = dispatch().clCreateKernel(
                pOverrides->Program,
                "block_motion_estimate_intel",
                &errorCode );
        }

        if( errorCode == CL_SUCCESS )
        {
            m_BuiltinKernelOverridesMap[ context ] = pOverrides;
        }
        else
        {
            delete pOverrides;
            pOverrides = NULL;
        }
    }

    log( "... builtin kernel override initialization complete.\n" );
}